

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  parasail_result_t *ppVar26;
  __m128i *ptr;
  __m128i *palVar27;
  __m128i *ptr_00;
  int16_t *ptr_01;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  __m128i *ptr_02;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  undefined2 uVar42;
  ulong size;
  short sVar43;
  undefined4 uVar44;
  short sVar47;
  short sVar49;
  ulong uVar45;
  short sVar48;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 auVar46 [16];
  short sVar53;
  undefined4 uVar54;
  short sVar71;
  ulong uVar56;
  undefined1 auVar57 [16];
  undefined4 uVar55;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  ushort uVar74;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ushort uVar97;
  int iVar98;
  ushort uVar100;
  ushort uVar101;
  int iVar102;
  ushort uVar103;
  ushort uVar104;
  int iVar105;
  ushort uVar106;
  ushort uVar107;
  undefined1 auVar99 [16];
  int iVar108;
  ushort uVar109;
  undefined1 auVar110 [16];
  int iVar114;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  int iVar125;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  short local_e8;
  short sStack_e6;
  ushort local_78;
  ushort uStack_76;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar88;
  short sVar96;
  short sVar116;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_striped_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_striped_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_striped_profile_sse2_128_16_cold_1();
        }
        else {
          uVar22 = uVar3 - 1;
          uVar32 = (ulong)uVar3 + 7;
          size = uVar32 >> 3;
          uVar45 = (ulong)uVar22 % size;
          iVar23 = (int)(uVar22 / size);
          uVar35 = -open;
          uVar39 = ppVar5->min;
          iVar34 = -uVar39;
          if (uVar39 != uVar35 && SBORROW4(uVar39,uVar35) == (int)(uVar39 + open) < 0) {
            iVar34 = open;
          }
          iVar36 = ppVar5->max;
          ppVar26 = parasail_result_new_table1((uint)uVar32 & 0x7ffffff8,s2Len);
          if (ppVar26 != (parasail_result_t *)0x0) {
            iVar29 = (uint)(s1_end != 0) * 0x10;
            ppVar26->flag =
                 iVar29 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar26->flag | 0x8220802;
            ptr = parasail_memalign___m128i(0x10,size);
            palVar27 = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            auVar57._0_4_ = -(uint)((int)ptr_00 == 0);
            auVar57._4_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
            auVar57._8_4_ = -(uint)((int)ptr_01 == 0);
            auVar57._12_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
            auVar46._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
            auVar46._4_4_ = -(uint)((int)palVar27 == 0 && (int)((ulong)palVar27 >> 0x20) == 0);
            auVar46._8_4_ = auVar57._0_4_ & auVar57._4_4_;
            auVar46._12_4_ = auVar57._8_4_ & auVar57._12_4_;
            iVar29 = movmskps(iVar29,auVar46);
            if (iVar29 == 0) {
              iVar29 = s2Len + -1;
              uVar30 = 7 - iVar23;
              auVar46 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar44 = auVar46._0_4_;
              auVar73._4_4_ = uVar44;
              auVar73._0_4_ = uVar44;
              auVar73._8_4_ = uVar44;
              auVar73._12_4_ = uVar44;
              auVar46 = pshuflw(auVar57,ZEXT416((uint)gap),0);
              uVar44 = auVar46._0_4_;
              uVar24 = iVar34 - 0x7fff;
              auVar46 = pshuflw(ZEXT416(uVar24),ZEXT416(uVar24),0);
              uVar54 = auVar46._0_4_;
              auVar57 = ZEXT416(CONCAT22((short)(uVar39 >> 0x10),0x7ffe - (short)iVar36));
              auVar57 = pshuflw(auVar57,auVar57,0);
              uVar55 = auVar57._0_4_;
              auVar60._4_4_ = uVar55;
              auVar60._0_4_ = uVar55;
              auVar60._8_4_ = uVar55;
              auVar60._12_4_ = uVar55;
              auVar58 = pshuflw(ZEXT416(uVar30),ZEXT416(uVar30),0);
              lVar31 = (long)(int)uVar35;
              uVar37 = 0;
              do {
                lVar40 = 0;
                lVar38 = lVar31;
                do {
                  lVar33 = lVar38;
                  if (s1_beg != 0) {
                    lVar33 = 0;
                  }
                  uVar42 = 0x8000;
                  if (-0x8000 < lVar33) {
                    uVar42 = (undefined2)lVar33;
                  }
                  *(undefined2 *)((long)&local_48 + lVar40 * 2) = uVar42;
                  lVar33 = lVar33 - (ulong)(uint)open;
                  if (lVar33 < -0x7fff) {
                    lVar33 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar40 * 2) = (short)lVar33;
                  lVar40 = lVar40 + 1;
                  lVar38 = lVar38 - size * (uint)gap;
                } while (lVar40 != 8);
                ptr[uVar37][0] = local_48;
                ptr[uVar37][1] = lStack_40;
                ptr_00[uVar37][0] = local_58;
                ptr_00[uVar37][1] = lStack_50;
                uVar37 = uVar37 + 1;
                lVar31 = lVar31 - (ulong)(uint)gap;
              } while (uVar37 != size);
              *ptr_01 = 0;
              auVar69 = _DAT_00903aa0;
              uVar37 = (ulong)(uint)s2Len;
              lVar31 = uVar37 - 1;
              auVar99._8_4_ = (int)lVar31;
              auVar99._0_8_ = lVar31;
              auVar99._12_4_ = (int)((ulong)lVar31 >> 0x20);
              iVar36 = -gap;
              iVar34 = gap * 2;
              auVar99 = auVar99 ^ _DAT_00903aa0;
              uVar41 = 0;
              uVar39 = uVar35;
              do {
                auVar63._0_4_ = (undefined4)uVar41;
                auVar75._8_4_ = auVar63._0_4_;
                auVar75._0_8_ = uVar41;
                auVar75._12_4_ = (int)(uVar41 >> 0x20);
                auVar59 = (auVar75 | _DAT_00903a90) ^ auVar69;
                iVar98 = auVar99._0_4_;
                iVar117 = -(uint)(iVar98 < auVar59._0_4_);
                iVar102 = auVar99._4_4_;
                iVar118 = -(uint)(iVar102 < auVar59._4_4_);
                iVar105 = auVar99._8_4_;
                iVar119 = -(uint)(iVar105 < auVar59._8_4_);
                iVar108 = auVar99._12_4_;
                iVar120 = -(uint)(iVar108 < auVar59._12_4_);
                auVar89._4_4_ = iVar117;
                auVar89._0_4_ = iVar117;
                auVar89._8_4_ = iVar119;
                auVar89._12_4_ = iVar119;
                auVar126 = pshuflw(in_XMM13,auVar89,0xe8);
                auVar77._0_4_ = -(uint)(auVar59._0_4_ == iVar98);
                auVar77._4_4_ = -(uint)(auVar59._4_4_ == iVar102);
                auVar77._8_4_ = -(uint)(auVar59._8_4_ == iVar105);
                auVar77._12_4_ = -(uint)(auVar59._12_4_ == iVar108);
                auVar121._4_4_ = auVar77._4_4_;
                auVar121._0_4_ = auVar77._4_4_;
                auVar121._8_4_ = auVar77._12_4_;
                auVar121._12_4_ = auVar77._12_4_;
                auVar89 = pshuflw(auVar60,auVar121,0xe8);
                auVar127._4_4_ = iVar118;
                auVar127._0_4_ = iVar118;
                auVar127._8_4_ = iVar120;
                auVar127._12_4_ = iVar120;
                auVar60 = pshuflw(auVar77,auVar127,0xe8);
                auVar59._8_4_ = 0xffffffff;
                auVar59._0_8_ = 0xffffffffffffffff;
                auVar59._12_4_ = 0xffffffff;
                auVar59 = (auVar60 | auVar89 & auVar126) ^ auVar59;
                auVar60 = packssdw(auVar59,auVar59);
                iVar118 = gap * -3 + uVar39;
                uVar97 = -(ushort)(-0x8000 < iVar36 - open);
                uVar100 = -(ushort)(-0x8000 < (int)(uVar35 - iVar34));
                uVar101 = -(ushort)(-0x8000 < iVar118);
                uVar103 = 0;
                if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  uVar104 = ~-(ushort)(-0x8000 < (int)uVar39) & 0x8000 |
                            (ushort)uVar39 & -(ushort)(-0x8000 < (int)uVar39);
                  if (s2_beg != 0) {
                    uVar104 = uVar103;
                  }
                  ptr_01[uVar41 + 1] = uVar104;
                }
                auVar126._4_4_ = iVar117;
                auVar126._0_4_ = iVar117;
                auVar126._8_4_ = iVar119;
                auVar126._12_4_ = iVar119;
                auVar60 = auVar121 & auVar126 | auVar127;
                auVar60 = packssdw(auVar60,auVar60);
                auVar18._8_4_ = 0xffffffff;
                auVar18._0_8_ = 0xffffffffffffffff;
                auVar18._12_4_ = 0xffffffff;
                auVar60 = packssdw(auVar60 ^ auVar18,auVar60 ^ auVar18);
                if ((auVar60._0_4_ >> 0x10 & 1) != 0) {
                  uVar97 = ~uVar97 & 0x8000 | (ushort)(iVar36 - open) & uVar97;
                  if (s2_beg != 0) {
                    uVar97 = uVar103;
                  }
                  ptr_01[uVar41 + 2] = uVar97;
                }
                auVar60 = (auVar75 | _DAT_00903a80) ^ auVar69;
                iVar117 = -(uint)(iVar98 < auVar60._0_4_);
                iVar120 = -(uint)(iVar102 < auVar60._4_4_);
                iVar119 = -(uint)(iVar105 < auVar60._8_4_);
                iVar114 = -(uint)(iVar108 < auVar60._12_4_);
                auVar61._4_4_ = iVar117;
                auVar61._0_4_ = iVar117;
                auVar61._8_4_ = iVar119;
                auVar61._12_4_ = iVar119;
                iVar117 = -(uint)(auVar60._4_4_ == iVar102);
                iVar119 = -(uint)(auVar60._12_4_ == iVar108);
                auVar122._4_4_ = iVar117;
                auVar122._0_4_ = iVar117;
                auVar122._8_4_ = iVar119;
                auVar122._12_4_ = iVar119;
                auVar90._4_4_ = iVar120;
                auVar90._0_4_ = iVar120;
                auVar90._8_4_ = iVar114;
                auVar90._12_4_ = iVar114;
                auVar90 = auVar122 & auVar61 | auVar90;
                auVar60 = packssdw(auVar90,auVar90);
                auVar19._8_4_ = 0xffffffff;
                auVar19._0_8_ = 0xffffffffffffffff;
                auVar19._12_4_ = 0xffffffff;
                auVar60 = packssdw(auVar60 ^ auVar19,auVar60 ^ auVar19);
                if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  uVar97 = ~uVar100 & 0x8000 | (ushort)(uVar35 - iVar34) & uVar100;
                  if (s2_beg != 0) {
                    uVar97 = uVar103;
                  }
                  ptr_01[uVar41 + 3] = uVar97;
                }
                auVar89 = pshufhw(auVar61,auVar61,0x84);
                auVar59 = pshufhw(auVar60,auVar122,0x84);
                auVar15._4_4_ = iVar120;
                auVar15._0_4_ = iVar120;
                auVar15._8_4_ = iVar114;
                auVar15._12_4_ = iVar114;
                auVar60 = pshufhw(auVar89,auVar15,0x84);
                auVar62._8_4_ = 0xffffffff;
                auVar62._0_8_ = 0xffffffffffffffff;
                auVar62._12_4_ = 0xffffffff;
                auVar62 = (auVar60 | auVar59 & auVar89) ^ auVar62;
                auVar60 = packssdw(auVar62,auVar62);
                if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  uVar97 = ~uVar101 & 0x8000 | (ushort)iVar118 & uVar101;
                  if (s2_beg != 0) {
                    uVar97 = uVar103;
                  }
                  ptr_01[uVar41 + 4] = uVar97;
                }
                auVar63._4_4_ = auVar63._0_4_;
                auVar63._8_4_ = auVar63._0_4_;
                auVar63._12_4_ = auVar63._0_4_;
                auVar63 = auVar63 | _DAT_00904a90;
                auVar111._4_4_ = gap;
                auVar111._0_4_ = gap;
                auVar111._8_4_ = gap;
                auVar111._12_4_ = gap;
                auVar112._0_8_ = (ulong)(uint)gap * (ulong)auVar63._4_4_;
                auVar112._8_8_ = (auVar111._8_8_ & 0xffffffff) * (ulong)auVar63._12_4_;
                iVar118 = uVar35 - auVar63._0_4_ * gap;
                iVar117 = uVar35 - (int)auVar112._0_8_;
                iVar119 = uVar35 - (int)((auVar63._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                iVar120 = uVar35 - (int)auVar112._8_8_;
                uVar97 = -(ushort)(-0x8000 < iVar118);
                uVar100 = -(ushort)(-0x8000 < iVar117);
                uVar101 = -(ushort)(-0x8000 < iVar119);
                uVar104 = -(ushort)(-0x8000 < iVar120);
                auVar89 = (auVar75 | _DAT_00903ad0) ^ auVar69;
                auVar91._0_4_ = -(uint)(iVar98 < auVar89._0_4_);
                auVar91._4_4_ = -(uint)(iVar102 < auVar89._4_4_);
                auVar91._8_4_ = -(uint)(iVar105 < auVar89._8_4_);
                auVar91._12_4_ = -(uint)(iVar108 < auVar89._12_4_);
                auVar16._4_4_ = auVar91._0_4_;
                auVar16._0_4_ = auVar91._0_4_;
                auVar16._8_4_ = auVar91._8_4_;
                auVar16._12_4_ = auVar91._8_4_;
                auVar60 = pshuflw(auVar112,auVar16,0xe8);
                iVar114 = -(uint)(auVar89._4_4_ == iVar102);
                iVar125 = -(uint)(auVar89._12_4_ == iVar108);
                auVar64._4_4_ = iVar114;
                auVar64._0_4_ = iVar114;
                auVar64._8_4_ = iVar125;
                auVar64._12_4_ = iVar125;
                in_XMM13 = pshuflw(auVar127,auVar64,0xe8);
                in_XMM13 = in_XMM13 & auVar60;
                auVar65._4_4_ = auVar91._4_4_;
                auVar65._0_4_ = auVar91._4_4_;
                auVar65._8_4_ = auVar91._12_4_;
                auVar65._12_4_ = auVar91._12_4_;
                auVar60 = pshuflw(auVar91,auVar65,0xe8);
                auVar92._8_4_ = 0xffffffff;
                auVar92._0_8_ = 0xffffffffffffffff;
                auVar92._12_4_ = 0xffffffff;
                auVar92 = (auVar60 | in_XMM13) ^ auVar92;
                auVar60 = packssdw(auVar92,auVar92);
                if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  uVar97 = ~uVar97 & 0x8000 | (ushort)iVar118 & uVar97;
                  if (s2_beg != 0) {
                    uVar97 = uVar103;
                  }
                  ptr_01[uVar41 + 5] = uVar97;
                }
                auVar17._4_4_ = auVar91._0_4_;
                auVar17._0_4_ = auVar91._0_4_;
                auVar17._8_4_ = auVar91._8_4_;
                auVar17._12_4_ = auVar91._8_4_;
                auVar65 = auVar64 & auVar17 | auVar65;
                auVar60 = packssdw(auVar65,auVar65);
                auVar20._8_4_ = 0xffffffff;
                auVar20._0_8_ = 0xffffffffffffffff;
                auVar20._12_4_ = 0xffffffff;
                auVar60 = packssdw(auVar60 ^ auVar20,auVar60 ^ auVar20);
                if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  uVar97 = ~uVar100 & 0x8000 | (ushort)iVar117 & uVar100;
                  if (s2_beg != 0) {
                    uVar97 = uVar103;
                  }
                  ptr_01[uVar41 + 6] = uVar97;
                }
                auVar60 = (auVar75 | _DAT_00903ac0) ^ auVar69;
                auVar93._0_4_ = -(uint)(iVar98 < auVar60._0_4_);
                auVar93._4_4_ = -(uint)(iVar102 < auVar60._4_4_);
                auVar93._8_4_ = -(uint)(iVar105 < auVar60._8_4_);
                auVar93._12_4_ = -(uint)(iVar108 < auVar60._12_4_);
                auVar66._4_4_ = auVar93._0_4_;
                auVar66._0_4_ = auVar93._0_4_;
                auVar66._8_4_ = auVar93._8_4_;
                auVar66._12_4_ = auVar93._8_4_;
                auVar76._4_4_ = -(uint)(auVar60._4_4_ == iVar102);
                auVar76._12_4_ = -(uint)(auVar60._12_4_ == iVar108);
                auVar76._0_4_ = auVar76._4_4_;
                auVar76._8_4_ = auVar76._12_4_;
                auVar123._4_4_ = auVar93._4_4_;
                auVar123._0_4_ = auVar93._4_4_;
                auVar123._8_4_ = auVar93._12_4_;
                auVar123._12_4_ = auVar93._12_4_;
                auVar60 = packssdw(auVar93,auVar76 & auVar66 | auVar123);
                auVar21._8_4_ = 0xffffffff;
                auVar21._0_8_ = 0xffffffffffffffff;
                auVar21._12_4_ = 0xffffffff;
                auVar60 = packssdw(auVar60 ^ auVar21,auVar60 ^ auVar21);
                if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  uVar97 = ~uVar101 & 0x8000 | (ushort)iVar119 & uVar101;
                  if (s2_beg != 0) {
                    uVar97 = uVar103;
                  }
                  ptr_01[uVar41 + 7] = uVar97;
                }
                auVar89 = pshufhw(auVar66,auVar66,0x84);
                auVar77 = pshufhw(auVar76,auVar76,0x84);
                auVar59 = pshufhw(auVar89,auVar123,0x84);
                auVar67._8_4_ = 0xffffffff;
                auVar67._0_8_ = 0xffffffffffffffff;
                auVar67._12_4_ = 0xffffffff;
                auVar67 = (auVar59 | auVar77 & auVar89) ^ auVar67;
                auVar89 = packssdw(auVar67,auVar67);
                if ((auVar89 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  uVar97 = ~uVar104 & 0x8000 | (ushort)iVar120 & uVar104;
                  if (s2_beg != 0) {
                    uVar97 = uVar103;
                  }
                  ptr_01[uVar41 + 8] = uVar97;
                }
                uVar41 = uVar41 + 8;
                iVar36 = iVar36 + gap * -8;
                uVar39 = uVar39 + gap * -8;
                iVar34 = iVar34 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar41);
              uVar39 = (uint)size;
              lVar31 = size * uVar37;
              lVar38 = 0;
              local_e8 = auVar58._0_2_;
              sStack_e6 = auVar58._2_2_;
              auVar124._0_2_ = -(ushort)(local_e8 == 7);
              auVar124._2_2_ = -(ushort)(sStack_e6 == 6);
              auVar124._4_2_ = -(ushort)(local_e8 == 5);
              auVar124._6_2_ = -(ushort)(sStack_e6 == 4);
              auVar124._8_2_ = -(ushort)(local_e8 == 3);
              auVar124._10_2_ = -(ushort)(sStack_e6 == 2);
              auVar124._12_2_ = -(ushort)(local_e8 == 1);
              auVar124._14_2_ = -(ushort)(sStack_e6 == 0);
              uVar41 = 0;
              auVar58._4_4_ = uVar54;
              auVar58._0_4_ = uVar54;
              auVar58._8_4_ = uVar54;
              auVar58._12_4_ = uVar54;
              local_78 = auVar57._0_2_;
              uStack_76 = auVar57._2_2_;
              auVar69 = auVar58;
              auVar94 = auVar58;
              iVar34 = iVar29;
              uVar97 = local_78;
              uVar100 = uStack_76;
              uVar101 = local_78;
              uVar103 = uStack_76;
              uVar104 = local_78;
              uVar106 = uStack_76;
              uVar107 = local_78;
              uVar109 = uStack_76;
              do {
                ptr_02 = ptr;
                ptr = palVar27;
                uVar28 = ptr_02[uVar39 - 1][0];
                iVar36 = ppVar5->mapper[(byte)s2[uVar41]];
                auVar113._8_8_ = ptr_02[uVar39 - 1][1] << 0x10 | uVar28 >> 0x30;
                auVar113._0_8_ = uVar28 << 0x10 | (ulong)(ushort)ptr_01[uVar41];
                lVar33 = 0;
                lVar40 = lVar38;
                auVar68 = auVar58;
                auVar57 = auVar94;
                do {
                  auVar99 = paddsw(auVar113,*(undefined1 (*) [16])
                                             ((long)pvVar4 + lVar33 + size * (long)iVar36 * 0x10));
                  auVar60 = *(undefined1 (*) [16])((long)*ptr_00 + lVar33);
                  sVar71 = auVar68._0_2_;
                  sVar47 = auVar60._0_2_;
                  uVar74 = (ushort)(sVar47 < sVar71) * sVar71 | (ushort)(sVar47 >= sVar71) * sVar47;
                  sVar116 = auVar68._2_2_;
                  sVar48 = auVar60._2_2_;
                  uVar81 = (ushort)(sVar48 < sVar116) * sVar116 |
                           (ushort)(sVar48 >= sVar116) * sVar48;
                  sVar7 = auVar68._4_2_;
                  sVar49 = auVar60._4_2_;
                  uVar82 = (ushort)(sVar49 < sVar7) * sVar7 | (ushort)(sVar49 >= sVar7) * sVar49;
                  sVar8 = auVar68._6_2_;
                  sVar50 = auVar60._6_2_;
                  uVar83 = (ushort)(sVar50 < sVar8) * sVar8 | (ushort)(sVar50 >= sVar8) * sVar50;
                  sVar9 = auVar68._8_2_;
                  sVar51 = auVar60._8_2_;
                  uVar84 = (ushort)(sVar51 < sVar9) * sVar9 | (ushort)(sVar51 >= sVar9) * sVar51;
                  sVar10 = auVar68._10_2_;
                  sVar52 = auVar60._10_2_;
                  uVar85 = (ushort)(sVar52 < sVar10) * sVar10 | (ushort)(sVar52 >= sVar10) * sVar52;
                  sVar11 = auVar68._12_2_;
                  sVar53 = auVar60._12_2_;
                  sVar88 = auVar60._14_2_;
                  uVar86 = (ushort)(sVar53 < sVar11) * sVar11 | (ushort)(sVar53 >= sVar11) * sVar53;
                  sVar43 = auVar68._14_2_;
                  uVar87 = (ushort)(sVar88 < sVar43) * sVar43 | (ushort)(sVar88 >= sVar43) * sVar88;
                  sVar72 = auVar99._0_2_;
                  auVar78._0_2_ =
                       (ushort)((short)uVar74 < sVar72) * sVar72 |
                       ((short)uVar74 >= sVar72) * uVar74;
                  sVar72 = auVar99._2_2_;
                  auVar78._2_2_ =
                       (ushort)((short)uVar81 < sVar72) * sVar72 |
                       ((short)uVar81 >= sVar72) * uVar81;
                  sVar72 = auVar99._4_2_;
                  auVar78._4_2_ =
                       (ushort)((short)uVar82 < sVar72) * sVar72 |
                       ((short)uVar82 >= sVar72) * uVar82;
                  sVar72 = auVar99._6_2_;
                  auVar78._6_2_ =
                       (ushort)((short)uVar83 < sVar72) * sVar72 |
                       ((short)uVar83 >= sVar72) * uVar83;
                  sVar72 = auVar99._8_2_;
                  auVar78._8_2_ =
                       (ushort)((short)uVar84 < sVar72) * sVar72 |
                       ((short)uVar84 >= sVar72) * uVar84;
                  sVar72 = auVar99._10_2_;
                  auVar78._10_2_ =
                       (ushort)((short)uVar85 < sVar72) * sVar72 |
                       ((short)uVar85 >= sVar72) * uVar85;
                  sVar72 = auVar99._12_2_;
                  auVar78._12_2_ =
                       (ushort)((short)uVar86 < sVar72) * sVar72 |
                       ((short)uVar86 >= sVar72) * uVar86;
                  sVar72 = auVar99._14_2_;
                  auVar78._14_2_ =
                       (ushort)((short)uVar87 < sVar72) * sVar72 |
                       ((short)uVar87 >= sVar72) * uVar87;
                  *(undefined1 (*) [16])((long)*ptr + lVar33) = auVar78;
                  piVar6 = ((ppVar26->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar40) = (int)(short)auVar78._0_2_;
                  *(int *)((long)piVar6 + lVar31 * 4 + lVar40) = (int)(short)auVar78._2_2_;
                  *(int *)((long)piVar6 + lVar31 * 8 + lVar40) = (int)(short)auVar78._4_2_;
                  *(int *)((long)piVar6 + lVar31 * 0xc + lVar40) = (int)(short)auVar78._6_2_;
                  *(int *)((long)piVar6 + lVar31 * 0x10 + lVar40) = (int)(short)auVar78._8_2_;
                  *(int *)((long)piVar6 + lVar31 * 0x14 + lVar40) = (int)(short)auVar78._10_2_;
                  *(int *)((long)piVar6 + lVar31 * 0x18 + lVar40) = (int)(short)auVar78._12_2_;
                  *(int *)((long)piVar6 + lVar31 * 0x1c + lVar40) = (int)(short)auVar78._14_2_;
                  sVar72 = auVar57._0_2_;
                  auVar94._0_2_ =
                       (sVar72 < (short)auVar78._0_2_) * auVar78._0_2_ |
                       (ushort)(sVar72 >= (short)auVar78._0_2_) * sVar72;
                  sVar72 = auVar57._2_2_;
                  auVar94._2_2_ =
                       (sVar72 < (short)auVar78._2_2_) * auVar78._2_2_ |
                       (ushort)(sVar72 >= (short)auVar78._2_2_) * sVar72;
                  sVar72 = auVar57._4_2_;
                  auVar94._4_2_ =
                       (sVar72 < (short)auVar78._4_2_) * auVar78._4_2_ |
                       (ushort)(sVar72 >= (short)auVar78._4_2_) * sVar72;
                  sVar72 = auVar57._6_2_;
                  auVar94._6_2_ =
                       (sVar72 < (short)auVar78._6_2_) * auVar78._6_2_ |
                       (ushort)(sVar72 >= (short)auVar78._6_2_) * sVar72;
                  sVar72 = auVar57._8_2_;
                  auVar94._8_2_ =
                       (sVar72 < (short)auVar78._8_2_) * auVar78._8_2_ |
                       (ushort)(sVar72 >= (short)auVar78._8_2_) * sVar72;
                  sVar72 = auVar57._10_2_;
                  auVar94._10_2_ =
                       (sVar72 < (short)auVar78._10_2_) * auVar78._10_2_ |
                       (ushort)(sVar72 >= (short)auVar78._10_2_) * sVar72;
                  sVar72 = auVar57._12_2_;
                  sVar96 = auVar57._14_2_;
                  auVar94._12_2_ =
                       (sVar72 < (short)auVar78._12_2_) * auVar78._12_2_ |
                       (ushort)(sVar72 >= (short)auVar78._12_2_) * sVar72;
                  auVar94._14_2_ =
                       (sVar96 < (short)auVar78._14_2_) * auVar78._14_2_ |
                       (ushort)(sVar96 >= (short)auVar78._14_2_) * sVar96;
                  uVar97 = (ushort)(sVar47 < (short)uVar97) * sVar47 |
                           (sVar47 >= (short)uVar97) * uVar97;
                  uVar100 = (ushort)(sVar48 < (short)uVar100) * sVar48 |
                            (sVar48 >= (short)uVar100) * uVar100;
                  uVar101 = (ushort)(sVar49 < (short)uVar101) * sVar49 |
                            (sVar49 >= (short)uVar101) * uVar101;
                  uVar103 = (ushort)(sVar50 < (short)uVar103) * sVar50 |
                            (sVar50 >= (short)uVar103) * uVar103;
                  uVar104 = (ushort)(sVar51 < (short)uVar104) * sVar51 |
                            (sVar51 >= (short)uVar104) * uVar104;
                  uVar106 = (ushort)(sVar52 < (short)uVar106) * sVar52 |
                            (sVar52 >= (short)uVar106) * uVar106;
                  uVar107 = (ushort)(sVar53 < (short)uVar107) * sVar53 |
                            (sVar53 >= (short)uVar107) * uVar107;
                  uVar109 = (ushort)(sVar88 < (short)uVar109) * sVar88 |
                            (sVar88 >= (short)uVar109) * uVar109;
                  uVar97 = (ushort)(sVar71 < (short)uVar97) * sVar71 |
                           (sVar71 >= (short)uVar97) * uVar97;
                  uVar100 = (ushort)(sVar116 < (short)uVar100) * sVar116 |
                            (sVar116 >= (short)uVar100) * uVar100;
                  uVar101 = (ushort)(sVar7 < (short)uVar101) * sVar7 |
                            (sVar7 >= (short)uVar101) * uVar101;
                  uVar103 = (ushort)(sVar8 < (short)uVar103) * sVar8 |
                            (sVar8 >= (short)uVar103) * uVar103;
                  uVar104 = (ushort)(sVar9 < (short)uVar104) * sVar9 |
                            (sVar9 >= (short)uVar104) * uVar104;
                  uVar106 = (ushort)(sVar10 < (short)uVar106) * sVar10 |
                            (sVar10 >= (short)uVar106) * uVar106;
                  uVar107 = (ushort)(sVar11 < (short)uVar107) * sVar11 |
                            (sVar11 >= (short)uVar107) * uVar107;
                  uVar109 = (ushort)(sVar43 < (short)uVar109) * sVar43 |
                            (sVar43 >= (short)uVar109) * uVar109;
                  uVar97 = ((short)auVar78._0_2_ < (short)uVar97) * auVar78._0_2_ |
                           ((short)auVar78._0_2_ >= (short)uVar97) * uVar97;
                  uVar100 = ((short)auVar78._2_2_ < (short)uVar100) * auVar78._2_2_ |
                            ((short)auVar78._2_2_ >= (short)uVar100) * uVar100;
                  uVar101 = ((short)auVar78._4_2_ < (short)uVar101) * auVar78._4_2_ |
                            ((short)auVar78._4_2_ >= (short)uVar101) * uVar101;
                  uVar103 = ((short)auVar78._6_2_ < (short)uVar103) * auVar78._6_2_ |
                            ((short)auVar78._6_2_ >= (short)uVar103) * uVar103;
                  uVar104 = ((short)auVar78._8_2_ < (short)uVar104) * auVar78._8_2_ |
                            ((short)auVar78._8_2_ >= (short)uVar104) * uVar104;
                  uVar106 = ((short)auVar78._10_2_ < (short)uVar106) * auVar78._10_2_ |
                            ((short)auVar78._10_2_ >= (short)uVar106) * uVar106;
                  uVar107 = ((short)auVar78._12_2_ < (short)uVar107) * auVar78._12_2_ |
                            ((short)auVar78._12_2_ >= (short)uVar107) * uVar107;
                  uVar109 = ((short)auVar78._14_2_ < (short)uVar109) * auVar78._14_2_ |
                            ((short)auVar78._14_2_ >= (short)uVar109) * uVar109;
                  auVar57 = psubsw(auVar78,auVar73);
                  auVar12._4_4_ = uVar44;
                  auVar12._0_4_ = uVar44;
                  auVar12._8_4_ = uVar44;
                  auVar12._12_4_ = uVar44;
                  auVar60 = psubsw(auVar60,auVar12);
                  sVar71 = auVar57._0_2_;
                  sVar43 = auVar60._0_2_;
                  sVar72 = auVar57._2_2_;
                  sVar47 = auVar60._2_2_;
                  sVar116 = auVar57._4_2_;
                  sVar48 = auVar60._4_2_;
                  sVar7 = auVar57._6_2_;
                  sVar49 = auVar60._6_2_;
                  sVar8 = auVar57._8_2_;
                  sVar50 = auVar60._8_2_;
                  sVar9 = auVar57._10_2_;
                  sVar51 = auVar60._10_2_;
                  sVar10 = auVar57._12_2_;
                  sVar52 = auVar60._12_2_;
                  sVar53 = auVar60._14_2_;
                  sVar11 = auVar57._14_2_;
                  puVar1 = (ushort *)((long)*ptr_00 + lVar33);
                  *puVar1 = (ushort)(sVar43 < sVar71) * sVar71 | (ushort)(sVar43 >= sVar71) * sVar43
                  ;
                  puVar1[1] = (ushort)(sVar47 < sVar72) * sVar72 |
                              (ushort)(sVar47 >= sVar72) * sVar47;
                  puVar1[2] = (ushort)(sVar48 < sVar116) * sVar116 |
                              (ushort)(sVar48 >= sVar116) * sVar48;
                  puVar1[3] = (ushort)(sVar49 < sVar7) * sVar7 | (ushort)(sVar49 >= sVar7) * sVar49;
                  puVar1[4] = (ushort)(sVar50 < sVar8) * sVar8 | (ushort)(sVar50 >= sVar8) * sVar50;
                  puVar1[5] = (ushort)(sVar51 < sVar9) * sVar9 | (ushort)(sVar51 >= sVar9) * sVar51;
                  puVar1[6] = (ushort)(sVar52 < sVar10) * sVar10 |
                              (ushort)(sVar52 >= sVar10) * sVar52;
                  puVar1[7] = (ushort)(sVar53 < sVar11) * sVar11 |
                              (ushort)(sVar53 >= sVar11) * sVar53;
                  auVar13._4_4_ = uVar44;
                  auVar13._0_4_ = uVar44;
                  auVar13._8_4_ = uVar44;
                  auVar13._12_4_ = uVar44;
                  auVar57 = psubsw(auVar68,auVar13);
                  sVar43 = auVar57._0_2_;
                  auVar68._0_2_ =
                       (ushort)(sVar43 < sVar71) * sVar71 | (ushort)(sVar43 >= sVar71) * sVar43;
                  sVar71 = auVar57._2_2_;
                  auVar68._2_2_ =
                       (ushort)(sVar71 < sVar72) * sVar72 | (ushort)(sVar71 >= sVar72) * sVar71;
                  sVar71 = auVar57._4_2_;
                  auVar68._4_2_ =
                       (ushort)(sVar71 < sVar116) * sVar116 | (ushort)(sVar71 >= sVar116) * sVar71;
                  sVar71 = auVar57._6_2_;
                  auVar68._6_2_ =
                       (ushort)(sVar71 < sVar7) * sVar7 | (ushort)(sVar71 >= sVar7) * sVar71;
                  sVar71 = auVar57._8_2_;
                  auVar68._8_2_ =
                       (ushort)(sVar71 < sVar8) * sVar8 | (ushort)(sVar71 >= sVar8) * sVar71;
                  sVar71 = auVar57._10_2_;
                  auVar68._10_2_ =
                       (ushort)(sVar71 < sVar9) * sVar9 | (ushort)(sVar71 >= sVar9) * sVar71;
                  sVar71 = auVar57._12_2_;
                  sVar72 = auVar57._14_2_;
                  auVar68._12_2_ =
                       (ushort)(sVar71 < sVar10) * sVar10 | (ushort)(sVar71 >= sVar10) * sVar71;
                  auVar68._14_2_ =
                       (ushort)(sVar72 < sVar11) * sVar11 | (ushort)(sVar72 >= sVar11) * sVar72;
                  auVar113 = *(undefined1 (*) [16])((long)*ptr_02 + lVar33);
                  lVar33 = lVar33 + 0x10;
                  lVar40 = lVar40 + uVar37 * 4;
                  auVar57 = auVar94;
                } while (size << 4 != lVar33);
                iVar36 = 0;
                do {
                  uVar25 = uVar35;
                  if (s2_beg == 0) {
                    uVar25 = ptr_01[uVar41 + 1] - open;
                  }
                  uVar28 = (ulong)uVar25;
                  if ((int)uVar25 < -0x7fff) {
                    uVar28 = 0xffff8000;
                  }
                  uVar56 = auVar68._0_8_;
                  auVar68._8_8_ = auVar68._8_8_ << 0x10 | uVar56 >> 0x30;
                  auVar68._0_8_ = uVar56 << 0x10 | uVar28 & 0xffff;
                  lVar33 = 0;
                  lVar40 = lVar38;
                  auVar57 = auVar94;
                  do {
                    psVar2 = (short *)((long)*ptr + lVar33);
                    sVar72 = *psVar2;
                    sVar116 = psVar2[1];
                    sVar7 = psVar2[2];
                    sVar8 = psVar2[3];
                    sVar9 = psVar2[4];
                    sVar10 = psVar2[5];
                    sVar11 = psVar2[6];
                    sVar43 = psVar2[7];
                    sVar71 = auVar68._0_2_;
                    auVar79._0_2_ =
                         (ushort)(sVar72 < sVar71) * sVar71 | (ushort)(sVar72 >= sVar71) * sVar72;
                    sVar71 = auVar68._2_2_;
                    auVar79._2_2_ =
                         (ushort)(sVar116 < sVar71) * sVar71 | (ushort)(sVar116 >= sVar71) * sVar116
                    ;
                    sVar71 = auVar68._4_2_;
                    auVar79._4_2_ =
                         (ushort)(sVar7 < sVar71) * sVar71 | (ushort)(sVar7 >= sVar71) * sVar7;
                    sVar71 = auVar68._6_2_;
                    auVar79._6_2_ =
                         (ushort)(sVar8 < sVar71) * sVar71 | (ushort)(sVar8 >= sVar71) * sVar8;
                    sVar71 = auVar68._8_2_;
                    auVar79._8_2_ =
                         (ushort)(sVar9 < sVar71) * sVar71 | (ushort)(sVar9 >= sVar71) * sVar9;
                    sVar71 = auVar68._10_2_;
                    auVar79._10_2_ =
                         (ushort)(sVar10 < sVar71) * sVar71 | (ushort)(sVar10 >= sVar71) * sVar10;
                    sVar71 = auVar68._12_2_;
                    auVar79._12_2_ =
                         (ushort)(sVar11 < sVar71) * sVar71 | (ushort)(sVar11 >= sVar71) * sVar11;
                    sVar71 = auVar68._14_2_;
                    auVar79._14_2_ =
                         (ushort)(sVar43 < sVar71) * sVar71 | (ushort)(sVar43 >= sVar71) * sVar43;
                    *(undefined1 (*) [16])((long)*ptr + lVar33) = auVar79;
                    uVar97 = ((short)auVar79._0_2_ < (short)uVar97) * auVar79._0_2_ |
                             ((short)auVar79._0_2_ >= (short)uVar97) * uVar97;
                    uVar100 = ((short)auVar79._2_2_ < (short)uVar100) * auVar79._2_2_ |
                              ((short)auVar79._2_2_ >= (short)uVar100) * uVar100;
                    uVar101 = ((short)auVar79._4_2_ < (short)uVar101) * auVar79._4_2_ |
                              ((short)auVar79._4_2_ >= (short)uVar101) * uVar101;
                    uVar103 = ((short)auVar79._6_2_ < (short)uVar103) * auVar79._6_2_ |
                              ((short)auVar79._6_2_ >= (short)uVar103) * uVar103;
                    uVar104 = ((short)auVar79._8_2_ < (short)uVar104) * auVar79._8_2_ |
                              ((short)auVar79._8_2_ >= (short)uVar104) * uVar104;
                    uVar106 = ((short)auVar79._10_2_ < (short)uVar106) * auVar79._10_2_ |
                              ((short)auVar79._10_2_ >= (short)uVar106) * uVar106;
                    uVar107 = ((short)auVar79._12_2_ < (short)uVar107) * auVar79._12_2_ |
                              ((short)auVar79._12_2_ >= (short)uVar107) * uVar107;
                    uVar109 = ((short)auVar79._14_2_ < (short)uVar109) * auVar79._14_2_ |
                              ((short)auVar79._14_2_ >= (short)uVar109) * uVar109;
                    sVar71 = auVar57._0_2_;
                    auVar94._0_2_ =
                         (sVar71 < (short)auVar79._0_2_) * auVar79._0_2_ |
                         (ushort)(sVar71 >= (short)auVar79._0_2_) * sVar71;
                    sVar71 = auVar57._2_2_;
                    auVar94._2_2_ =
                         (sVar71 < (short)auVar79._2_2_) * auVar79._2_2_ |
                         (ushort)(sVar71 >= (short)auVar79._2_2_) * sVar71;
                    sVar71 = auVar57._4_2_;
                    auVar94._4_2_ =
                         (sVar71 < (short)auVar79._4_2_) * auVar79._4_2_ |
                         (ushort)(sVar71 >= (short)auVar79._4_2_) * sVar71;
                    sVar71 = auVar57._6_2_;
                    auVar94._6_2_ =
                         (sVar71 < (short)auVar79._6_2_) * auVar79._6_2_ |
                         (ushort)(sVar71 >= (short)auVar79._6_2_) * sVar71;
                    sVar71 = auVar57._8_2_;
                    auVar94._8_2_ =
                         (sVar71 < (short)auVar79._8_2_) * auVar79._8_2_ |
                         (ushort)(sVar71 >= (short)auVar79._8_2_) * sVar71;
                    sVar71 = auVar57._10_2_;
                    auVar94._10_2_ =
                         (sVar71 < (short)auVar79._10_2_) * auVar79._10_2_ |
                         (ushort)(sVar71 >= (short)auVar79._10_2_) * sVar71;
                    sVar71 = auVar57._12_2_;
                    sVar72 = auVar57._14_2_;
                    auVar94._12_2_ =
                         (sVar71 < (short)auVar79._12_2_) * auVar79._12_2_ |
                         (ushort)(sVar71 >= (short)auVar79._12_2_) * sVar71;
                    auVar94._14_2_ =
                         (sVar72 < (short)auVar79._14_2_) * auVar79._14_2_ |
                         (ushort)(sVar72 >= (short)auVar79._14_2_) * sVar72;
                    piVar6 = ((ppVar26->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + lVar40) = (int)(short)auVar79._0_2_;
                    *(int *)((long)piVar6 + lVar31 * 4 + lVar40) = (int)(short)auVar79._2_2_;
                    *(int *)((long)piVar6 + lVar31 * 8 + lVar40) = (int)(short)auVar79._4_2_;
                    *(int *)((long)piVar6 + lVar31 * 0xc + lVar40) = (int)(short)auVar79._6_2_;
                    *(int *)((long)piVar6 + lVar31 * 0x10 + lVar40) = (int)(short)auVar79._8_2_;
                    *(int *)((long)piVar6 + lVar31 * 0x14 + lVar40) = (int)(short)auVar79._10_2_;
                    *(int *)((long)piVar6 + lVar31 * 0x18 + lVar40) = (int)(short)auVar79._12_2_;
                    *(int *)((long)piVar6 + lVar31 * 0x1c + lVar40) = (int)(short)auVar79._14_2_;
                    auVar57 = psubsw(auVar79,auVar73);
                    auVar14._4_4_ = uVar44;
                    auVar14._0_4_ = uVar44;
                    auVar14._8_4_ = uVar44;
                    auVar14._12_4_ = uVar44;
                    auVar68 = psubsw(auVar68,auVar14);
                    auVar110._0_2_ = -(ushort)(auVar57._0_2_ < auVar68._0_2_);
                    auVar110._2_2_ = -(ushort)(auVar57._2_2_ < auVar68._2_2_);
                    auVar110._4_2_ = -(ushort)(auVar57._4_2_ < auVar68._4_2_);
                    auVar110._6_2_ = -(ushort)(auVar57._6_2_ < auVar68._6_2_);
                    auVar110._8_2_ = -(ushort)(auVar57._8_2_ < auVar68._8_2_);
                    auVar110._10_2_ = -(ushort)(auVar57._10_2_ < auVar68._10_2_);
                    auVar110._12_2_ = -(ushort)(auVar57._12_2_ < auVar68._12_2_);
                    auVar110._14_2_ = -(ushort)(auVar57._14_2_ < auVar68._14_2_);
                    if ((((((((((((((((auVar110 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar110 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar110 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar110 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar110 >> 0x27 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar110 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar110 >> 0x37 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar110 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar110 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar110 >> 0x4f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar110 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar110 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar110 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar110 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar110._14_2_ >> 7 & 1) == 0) && (auVar110._14_2_ & 0x8000) == 0)
                    goto LAB_005c4fc8;
                    lVar33 = lVar33 + 0x10;
                    lVar40 = lVar40 + uVar37 * 4;
                    auVar57 = auVar94;
                  } while (size << 4 != lVar33);
                  iVar36 = iVar36 + 1;
                } while (iVar36 != 8);
LAB_005c4fc8:
                palVar27 = ptr + uVar45;
                sVar71 = (short)(*palVar27)[0];
                sVar72 = *(short *)((long)*palVar27 + 2);
                sVar116 = *(short *)((long)*palVar27 + 4);
                sVar7 = *(short *)((long)*palVar27 + 6);
                sVar8 = (short)(*palVar27)[1];
                sVar9 = *(short *)((long)*palVar27 + 10);
                sVar10 = *(short *)((long)*palVar27 + 0xc);
                sVar11 = *(short *)((long)*palVar27 + 0xe);
                sVar43 = auVar69._0_2_;
                auVar80._0_2_ = -(ushort)(sVar43 < sVar71);
                sVar47 = auVar69._2_2_;
                auVar80._2_2_ = -(ushort)(sVar47 < sVar72);
                sVar48 = auVar69._4_2_;
                auVar80._4_2_ = -(ushort)(sVar48 < sVar116);
                sVar49 = auVar69._6_2_;
                auVar80._6_2_ = -(ushort)(sVar49 < sVar7);
                sVar50 = auVar69._8_2_;
                auVar80._8_2_ = -(ushort)(sVar50 < sVar8);
                sVar51 = auVar69._10_2_;
                auVar80._10_2_ = -(ushort)(sVar51 < sVar9);
                sVar52 = auVar69._12_2_;
                auVar80._12_2_ = -(ushort)(sVar52 < sVar10);
                sVar53 = auVar69._14_2_;
                auVar80._14_2_ = -(ushort)(sVar53 < sVar11);
                auVar80 = auVar80 & auVar124;
                auVar69._0_2_ =
                     (ushort)(sVar71 < sVar43) * sVar43 | (ushort)(sVar71 >= sVar43) * sVar71;
                auVar69._2_2_ =
                     (ushort)(sVar72 < sVar47) * sVar47 | (ushort)(sVar72 >= sVar47) * sVar72;
                auVar69._4_2_ =
                     (ushort)(sVar116 < sVar48) * sVar48 | (ushort)(sVar116 >= sVar48) * sVar116;
                auVar69._6_2_ =
                     (ushort)(sVar7 < sVar49) * sVar49 | (ushort)(sVar7 >= sVar49) * sVar7;
                auVar69._8_2_ =
                     (ushort)(sVar8 < sVar50) * sVar50 | (ushort)(sVar8 >= sVar50) * sVar8;
                auVar69._10_2_ =
                     (ushort)(sVar9 < sVar51) * sVar51 | (ushort)(sVar9 >= sVar51) * sVar9;
                auVar69._12_2_ =
                     (ushort)(sVar10 < sVar52) * sVar52 | (ushort)(sVar10 >= sVar52) * sVar10;
                auVar69._14_2_ =
                     (ushort)(sVar11 < sVar53) * sVar53 | (ushort)(sVar11 >= sVar53) * sVar11;
                if ((((((((((((((((auVar80 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar80 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar80 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar80 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar80 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar80 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar80 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar80 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar80 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar80 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar80 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar80 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar80[0xf] < '\0') {
                  iVar34 = (int)uVar41;
                }
                uVar41 = uVar41 + 1;
                lVar38 = lVar38 + 4;
                palVar27 = ptr_02;
                if (uVar41 == uVar37) {
                  if (s2_end != 0) {
                    if (iVar23 < 7) {
                      iVar36 = 0;
                      auVar57 = auVar69;
                      do {
                        auVar70._0_8_ = auVar57._0_8_ << 0x10;
                        auVar70._8_8_ = auVar57._8_8_ << 0x10 | auVar57._0_8_ >> 0x30;
                        auVar69._14_2_ = auVar57._12_2_;
                        iVar36 = iVar36 + 1;
                        auVar57 = auVar70;
                      } while (iVar36 < (int)uVar30);
                    }
                    uVar24 = (uint)auVar69._14_2_;
                  }
                  sVar71 = (short)uVar24;
                  uVar35 = uVar22;
                  if ((s1_end != 0) && ((uVar32 & 0x7ffffff8) != 0)) {
                    uVar32 = 0;
                    do {
                      uVar25 = ((uint)uVar32 & 7) * uVar39 + ((uint)(uVar32 >> 3) & 0x1fffffff);
                      if ((int)uVar25 < (int)uVar3) {
                        auVar69._14_2_ = *(ushort *)((long)*ptr + uVar32 * 2);
                        if ((short)(ushort)uVar24 < (short)auVar69._14_2_) {
                          uVar24 = (uint)auVar69._14_2_;
                          iVar34 = iVar29;
                          uVar35 = uVar25;
                        }
                        else {
                          if ((int)uVar35 <= (int)uVar25) {
                            uVar25 = uVar35;
                          }
                          if (iVar34 != iVar29) {
                            uVar25 = uVar35;
                          }
                          if (auVar69._14_2_ == (ushort)uVar24) {
                            uVar35 = uVar25;
                          }
                        }
                      }
                      sVar71 = (short)uVar24;
                      uVar32 = uVar32 + 1;
                    } while ((uVar39 & 0xfffffff) << 3 != (int)uVar32);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar32 = ptr[uVar45][1];
                    if (iVar23 < 7) {
                      iVar34 = 0;
                      uVar45 = ptr[uVar45][0];
                      do {
                        uVar32 = uVar32 << 0x10 | uVar45 >> 0x30;
                        iVar34 = iVar34 + 1;
                        uVar45 = uVar45 << 0x10;
                      } while (iVar34 < (int)uVar30);
                    }
                    sVar71 = (short)(uVar32 >> 0x30);
                    iVar34 = iVar29;
                    uVar35 = uVar22;
                  }
                  sVar72 = auVar46._0_2_;
                  auVar115._0_2_ = -(ushort)((short)uVar97 < sVar72);
                  sVar116 = auVar46._2_2_;
                  auVar115._2_2_ = -(ushort)((short)uVar100 < sVar116);
                  auVar115._4_2_ = -(ushort)((short)uVar101 < sVar72);
                  auVar115._6_2_ = -(ushort)((short)uVar103 < sVar116);
                  auVar115._8_2_ = -(ushort)((short)uVar104 < sVar72);
                  auVar115._10_2_ = -(ushort)((short)uVar106 < sVar116);
                  auVar115._12_2_ = -(ushort)((short)uVar107 < sVar72);
                  auVar115._14_2_ = -(ushort)((short)uVar109 < sVar116);
                  auVar95._0_2_ = -(ushort)((short)local_78 < (short)auVar94._0_2_);
                  auVar95._2_2_ = -(ushort)((short)uStack_76 < (short)auVar94._2_2_);
                  auVar95._4_2_ = -(ushort)((short)local_78 < (short)auVar94._4_2_);
                  auVar95._6_2_ = -(ushort)((short)uStack_76 < (short)auVar94._6_2_);
                  auVar95._8_2_ = -(ushort)((short)local_78 < (short)auVar94._8_2_);
                  auVar95._10_2_ = -(ushort)((short)uStack_76 < (short)auVar94._10_2_);
                  auVar95._12_2_ = -(ushort)((short)local_78 < (short)auVar94._12_2_);
                  auVar95._14_2_ = -(ushort)((short)uStack_76 < (short)auVar94._14_2_);
                  auVar95 = auVar95 | auVar115;
                  if ((((((((((((((((auVar95 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar95 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar95 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar95 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar95 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar95 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar95 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar95 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar95 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar95 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar95 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar95 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar95 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar95[0xf] < '\0') {
                    *(byte *)&ppVar26->flag = (byte)ppVar26->flag | 0x40;
                    sVar71 = 0;
                    iVar34 = 0;
                    uVar35 = 0;
                  }
                  ppVar26->score = (int)sVar71;
                  ppVar26->end_query = uVar35;
                  ppVar26->end_ref = iVar34;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar26;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}